

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

void BZ2_hbCreateDecodeTables
               (Int32 *limit,Int32 *base,Int32 *perm,UChar *length,Int32 minLen,Int32 maxLen,
               Int32 alphaSize)

{
  int local_40;
  int local_3c;
  Int32 vec;
  Int32 j;
  Int32 i;
  Int32 pp;
  Int32 maxLen_local;
  Int32 minLen_local;
  UChar *length_local;
  Int32 *perm_local;
  Int32 *base_local;
  Int32 *limit_local;
  
  j = 0;
  for (vec = minLen; vec <= maxLen; vec = vec + 1) {
    for (local_3c = 0; local_3c < alphaSize; local_3c = local_3c + 1) {
      if ((uint)length[local_3c] == vec) {
        perm[j] = local_3c;
        j = j + 1;
      }
    }
  }
  for (vec = 0; vec < 0x17; vec = vec + 1) {
    base[vec] = 0;
  }
  for (vec = 0; vec < alphaSize; vec = vec + 1) {
    base[(int)(length[vec] + 1)] = base[(int)(length[vec] + 1)] + 1;
  }
  for (vec = 1; vec < 0x17; vec = vec + 1) {
    base[vec] = base[vec + -1] + base[vec];
  }
  for (vec = 0; vec < 0x17; vec = vec + 1) {
    limit[vec] = 0;
  }
  local_40 = 0;
  for (vec = minLen; vec <= maxLen; vec = vec + 1) {
    local_40 = (base[vec + 1] - base[vec]) + local_40;
    limit[vec] = local_40 + -1;
    local_40 = local_40 * 2;
  }
  for (vec = minLen + 1; vec <= maxLen; vec = vec + 1) {
    base[vec] = (limit[vec + -1] + 1) * 2 - base[vec];
  }
  return;
}

Assistant:

void BZ2_hbCreateDecodeTables ( Int32 *limit,
                                Int32 *base,
                                Int32 *perm,
                                UChar *length,
                                Int32 minLen,
                                Int32 maxLen,
                                Int32 alphaSize )
{
   Int32 pp, i, j, vec;

   pp = 0;
   for (i = minLen; i <= maxLen; i++)
      for (j = 0; j < alphaSize; j++)
         if (length[j] == i) { perm[pp] = j; pp++; };

   for (i = 0; i < BZ_MAX_CODE_LEN; i++) base[i] = 0;
   for (i = 0; i < alphaSize; i++) base[length[i]+1]++;

   for (i = 1; i < BZ_MAX_CODE_LEN; i++) base[i] += base[i-1];

   for (i = 0; i < BZ_MAX_CODE_LEN; i++) limit[i] = 0;
   vec = 0;

   for (i = minLen; i <= maxLen; i++) {
      vec += (base[i+1] - base[i]);
      limit[i] = vec-1;
      vec <<= 1;
   }
   for (i = minLen + 1; i <= maxLen; i++)
      base[i] = ((limit[i-1] + 1) << 1) - base[i];
}